

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.cpp
# Opt level: O1

uint32_t nivalis::OpCode::from_char(char opchar)

{
  int iVar1;
  undefined7 in_register_00000039;
  
  iVar1 = (int)CONCAT71(in_register_00000039,opchar);
  if (iVar1 < 0x3c) {
    switch(iVar1) {
    case 0x25:
      return 0x32;
    case 0x26:
      return 0x52;
    case 0x2a:
      return 0x30;
    case 0x2b:
      return 0x20;
    case 0x2d:
      return 0x21;
    case 0x2f:
      return 0x31;
    }
  }
  else if (iVar1 < 0x3e) {
    if (iVar1 == 0x3c) {
      return 0x60;
    }
    if (iVar1 == 0x3d) {
      return 0x62;
    }
  }
  else {
    if (iVar1 == 0x3e) {
      return 0x65;
    }
    if (iVar1 == 0x5e) {
      return 0x40;
    }
    if (iVar1 == 0x7c) {
      return 0x53;
    }
  }
  return 0x18;
}

Assistant:

uint32_t from_char(char opchar) {
    switch (opchar) {
        case '+': return OpCode::add;
        case '-': return OpCode::sub;
        case '*': return OpCode::mul;
        case '/': return OpCode::divi;
        case '%': return OpCode::mod;
        case '^': return OpCode::power;
        case '<': return OpCode::lt;
        case '>': return OpCode::gt;
        case '=': return OpCode::eq;
        case '&': return OpCode::land;
        case '|': return OpCode::lor;
        default: return OpCode::bsel;
    };
}